

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::shrink(Buffer *this,off_t len)

{
  char *__src;
  char *__dest;
  ulong uVar1;
  
  if (len < this->capacity_) {
    uVar1 = 0xffffffffffffffff;
    if (-1 < len) {
      uVar1 = len;
    }
    __dest = (char *)operator_new__(uVar1);
    __src = this->buffer_;
    memcpy(__dest,__src,len);
    if (__src != (char *)0x0) {
      operator_delete__(__src);
    }
    this->buffer_ = __dest;
    this->capacity_ = len;
    this->leftIndex_ = 0;
    this->rightIndex_ = 0;
  }
  return;
}

Assistant:

void Buffer::shrink(off_t len) {
    if (len < capacity_) {
        char *newBuffer = new char[len];
        ::memcpy(newBuffer, buffer_, len);
        delete[] buffer_;
        buffer_ = newBuffer;
        capacity_ = len;
        leftIndex_ = rightIndex_ = 0;
    }
}